

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O1

void __thiscall
TPZFYsmpMatrix<std::complex<double>_>::MultiplyDummy
          (TPZFYsmpMatrix<std::complex<double>_> *this,TPZFYsmpMatrix<std::complex<double>_> *B,
          TPZFYsmpMatrix<std::complex<double>_> *Res)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  TPZFYsmpMatrix<std::complex<double>_> *local_60;
  long local_58;
  double local_50;
  double local_48;
  complex<double> local_40;
  
  lVar1 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  if ((B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow == lVar1) {
    if (0 < lVar1) {
      lVar4 = 0;
      local_60 = Res;
      do {
        local_58 = 0;
        do {
          dStack_80 = 0.0;
          local_88 = 0.0;
          lVar3 = 0;
          do {
            (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(this,lVar4,lVar3);
            local_50 = in_XMM1_Qa;
            local_48 = extraout_XMM0_Qa;
            (*(B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(B,lVar4,lVar3);
            local_78 = local_48;
            dStack_70 = local_50;
            std::complex<double>::operator*=((complex<double> *)&local_78,&local_40);
            lVar2 = local_58;
            local_88 = local_78 + local_88;
            dStack_80 = dStack_70 + dStack_80;
            lVar3 = lVar3 + 1;
          } while (lVar1 != lVar3);
          (*(local_60->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x23])(local_60,lVar4,local_58,&local_88);
          local_58 = lVar2 + 1;
        } while (local_58 != lVar1);
        lVar4 = lVar4 + 1;
      } while (lVar4 != lVar1);
    }
  }
  return;
}

Assistant:

void TPZFYsmpMatrix<TVar>::MultiplyDummy(TPZFYsmpMatrix<TVar> & B, TPZFYsmpMatrix<TVar> & Res){
    int64_t i,j,k;
    if (B.Rows()!=this->Rows()) return;
    int64_t rows = this->Rows();
    TVar aux=0.;
    for(i=0;i<rows;i++){
        for(j=0;j<rows;j++){
            for(k=0;k<rows;k++){
				// C[i][j] += A[i][k]*B[k][j];
				aux+=GetVal(i,k)*B.GetVal(i,k);
			}
			Res.PutVal(i,j,aux);
			aux=0.;
		}
    }
}